

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadLogicalExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *this,int opcode)

{
  LogicalExpr arg;
  LogicalArgHandler handler;
  PairwiseArgHandler handler_00;
  int opcode_00;
  OpCodeInfo *pOVar1;
  ExprBase condition_00;
  int in_ESI;
  ExprBase in_RDI;
  PairwiseArgHandler args_3;
  int num_args_1;
  LogicalArgHandler args_2;
  int num_args;
  LogicalExpr else_expr;
  LogicalExpr then_expr;
  LogicalExpr condition;
  char c;
  NumericExpr lhs;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::NumericExprReader>
  args_1;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::LogicalExprReader>
  args;
  Kind kind;
  OpCodeInfo *info;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe98;
  Kind in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  Kind in_stack_fffffffffffffea4;
  ExprBase in_stack_fffffffffffffea8;
  CStringRef in_stack_fffffffffffffec0;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *in_stack_fffffffffffffec8;
  BasicCStringRef<char> local_88;
  char local_79;
  ExprBase local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  ExprBase local_30;
  Kind local_24;
  OpCodeInfo *local_20;
  ExprBase local_8;
  
  local_20 = GetOpCodeInfo(in_ESI);
  local_24 = local_20->kind;
  condition_00.impl_._4_4_ = 0;
  condition_00.impl_._0_4_ = local_20->first_kind - NOT;
  switch(condition_00.impl_) {
  case (Impl *)0x0:
    local_30.impl_ =
         (Impl *)ReadLogicalExpr((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                                  *)condition_00.impl_);
    arg.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffe9c;
    arg.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffe98;
    local_8.impl_ =
         (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnNot
                           (in_stack_fffffffffffffe90,arg);
    break;
  case (Impl *)0x1:
    BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::LogicalExprReader>
    ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::LogicalExprReader>
                       *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                      (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    local_48 = local_40;
    local_50 = local_38;
    local_8.impl_ =
         (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnBinaryLogical
                           ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                            in_stack_fffffffffffffea8.impl_,in_stack_fffffffffffffea4,
                            (LogicalExpr)condition_00.impl_,(LogicalExpr)in_RDI.impl_);
    break;
  default:
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xfffffffffffffec0,
               "expected logical expression opcode");
    BinaryReaderBase::ReportError<>
              ((BinaryReaderBase *)condition_00.impl_,in_stack_fffffffffffffec0);
    BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr
              ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)0x2ad3f2);
    break;
  case (Impl *)0x4:
    BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::NumericExprReader>
    ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::NumericExprReader>
                       *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                      (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    local_68 = local_60;
    local_70 = local_58;
    local_8.impl_ =
         (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnRelational
                           ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                            in_stack_fffffffffffffea8.impl_,in_stack_fffffffffffffea4,
                            (NumericExpr)condition_00.impl_,(NumericExpr)in_RDI.impl_);
    break;
  case (Impl *)0xa:
    local_78.impl_ =
         (Impl *)ReadNumericExpr((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                 SUB81((ulong)in_stack_fffffffffffffe90 >> 0x38,0));
    local_79 = ReaderBase::ReadChar(*(ReaderBase **)in_RDI.impl_);
    if (local_79 == 'o') {
      opcode_00 = ReadOpCode((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      pOVar1 = GetOpCodeInfo(opcode_00);
      if (pOVar1->kind != COUNT) goto LAB_002ad13b;
    }
    else {
LAB_002ad13b:
      in_stack_fffffffffffffea4 = (Kind)((ulong)*(undefined8 *)in_RDI.impl_ >> 0x20);
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_88,"expected count expression");
      BinaryReaderBase::ReportError<>
                ((BinaryReaderBase *)condition_00.impl_,in_stack_fffffffffffffec0);
    }
    ReadCountExpr(in_stack_fffffffffffffec8);
    local_8.impl_ =
         (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnLogicalCount
                           ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                            in_stack_fffffffffffffea8.impl_,in_stack_fffffffffffffea4,
                            (NumericExpr)condition_00.impl_,(CountExpr)in_RDI.impl_);
    break;
  case (Impl *)0x10:
    ReadLogicalExpr((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                     *)condition_00.impl_);
    ReadLogicalExpr((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                     *)condition_00.impl_);
    ReadLogicalExpr((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                     *)condition_00.impl_);
    local_8.impl_ =
         (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnImplication
                           ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                            CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                            (LogicalExpr)condition_00.impl_,(LogicalExpr)in_RDI.impl_,
                            (LogicalExpr)in_stack_fffffffffffffea8.impl_);
    break;
  case (Impl *)0x11:
    ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                in_stack_fffffffffffffe9c);
    NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginIteratedLogical
              ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
    ::
    ReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::LogicalExprReader,mp::BasicExprFactory<std::allocator<char>>::BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>>
              ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe9c,
               (BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>_>
                *)in_stack_fffffffffffffe90);
    handler.impl_._4_4_ = in_stack_fffffffffffffea4;
    handler.impl_._0_4_ = in_stack_fffffffffffffea0;
    handler._8_8_ = in_stack_fffffffffffffea8.impl_;
    local_8.impl_ =
         (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::
                 EndIteratedLogical((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)
                                    ,handler);
    break;
  case (Impl *)0x13:
    ReadNumArgs((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                in_stack_fffffffffffffe9c);
    NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginPairwise
              ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
    ::
    ReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::NumericExprReader,mp::BasicExprFactory<std::allocator<char>>::BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>>
              ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe9c,
               (BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
                *)in_stack_fffffffffffffe90);
    handler_00.impl_._4_4_ = in_stack_fffffffffffffea4;
    handler_00.impl_._0_4_ = in_stack_fffffffffffffea0;
    handler_00._8_8_ = in_stack_fffffffffffffea8.impl_;
    local_8.impl_ =
         (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::EndPairwise
                           ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                            CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),handler_00
                           );
  }
  return (LogicalExpr)(ExprBase)local_8.impl_;
}

Assistant:

typename Handler::LogicalExpr
    NLReader<Reader, Handler>::ReadLogicalExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::NOT:
    return handler_.OnNot(ReadLogicalExpr());
  case expr::FIRST_BINARY_LOGICAL: {
    BinaryArgReader<LogicalExprReader> args(*this);
    return handler_.OnBinaryLogical(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_RELATIONAL: {
    BinaryArgReader<> args(*this);
    return handler_.OnRelational(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_LOGICAL_COUNT: {
    NumericExpr lhs = ReadNumericExpr();
    char c = reader_.ReadChar();
    if (c != 'o' || internal::GetOpCodeInfo(ReadOpCode()).kind != expr::COUNT)
      reader_.ReportError("expected count expression");
    return handler_.OnLogicalCount(kind, lhs, ReadCountExpr());
  }
  case expr::IMPLICATION: {
    // Read an implication (=>).
    LogicalExpr condition = ReadLogicalExpr();
    LogicalExpr then_expr = ReadLogicalExpr();
    LogicalExpr else_expr = ReadLogicalExpr();
    return handler_.OnImplication(condition, then_expr, else_expr);
  }
  case expr::FIRST_ITERATED_LOGICAL: {
    // Read an iterated logical expression (exists or forall).
    int num_args = ReadNumArgs();
    typename Handler::LogicalArgHandler args =
        handler_.BeginIteratedLogical(kind, num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndIteratedLogical(args);
  }
  case expr::FIRST_PAIRWISE: {
    // Read a pairwise expression (alldiff or !alldiff).
    int num_args = ReadNumArgs(1);
    typename Handler::PairwiseArgHandler args =
        handler_.BeginPairwise(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndPairwise(args);
  }
  default:
    reader_.ReportError("expected logical expression opcode");
  }
  return LogicalExpr();
}